

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase267::run(TestCase267 *this)

{
  Orphanage OVar1;
  Orphan<capnp::Text> orphan;
  ArrayPtr<const_char> local_168;
  WirePointer *local_158;
  Builder local_148;
  Builder root;
  bool local_108;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  OVar1 = MessageBuilder::getOrphanage(&builder.super_MessageBuilder);
  OrphanBuilder::copy((EVP_PKEY_CTX *)&root,(EVP_PKEY_CTX *)OVar1.arena);
  orphan.builder.capTable = (CapTableBuilder *)root._builder.data;
  orphan.builder.location = (word *)root._builder.pointers;
  orphan.builder.tag.content = (uint64_t)root._builder.segment;
  orphan.builder.segment = (SegmentBuilder *)root._builder.capTable;
  local_148.builder.segment = (SegmentBuilder *)0x2b530d;
  local_168 = (ArrayPtr<const_char>)OrphanBuilder::asTextReader(&orphan.builder);
  kj::_::DebugExpression<char_const(&)[9]>::operator==
            ((DebugComparison<const_char_(&)[9],_capnp::Text::Reader> *)&root,
             (DebugExpression<char_const(&)[9]> *)&local_148,(Reader *)&local_168);
  if ((local_108 == false) && (kj::_::Debug::minSeverity < 3)) {
    local_168 = (ArrayPtr<const_char>)OrphanBuilder::asTextReader(&orphan.builder);
    kj::_::Debug::
    log<char_const(&)[54],kj::_::DebugComparison<char_const(&)[9],capnp::Text::Reader>&,char_const(&)[9],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x10f,ERROR,
               "\"failed: expected \" \"(\\\"foobarba\\\") == (orphan.getReader())\", _kjCondition, \"foobarba\", orphan.getReader()"
               ,(char (*) [54])"failed: expected (\"foobarba\") == (orphan.getReader())",
               (DebugComparison<const_char_(&)[9],_capnp::Text::Reader> *)&root,
               (char (*) [9])"foobarba",(Reader *)&local_168);
  }
  MessageBuilder::getRootInternal(&local_148,&builder.super_MessageBuilder);
  local_158 = local_148.builder.pointer;
  local_168.ptr = (char *)local_148.builder.segment;
  PointerBuilder::initStruct(&root._builder,(PointerBuilder *)&local_168,(StructSize)0x140006);
  local_158 = root._builder.pointers;
  PointerBuilder::adopt((PointerBuilder *)&local_168,&orphan.builder);
  if (orphan.builder.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&orphan.builder);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, OrphanageTextCopy) {
  MallocMessageBuilder builder;

  Orphan<Text> orphan = builder.getOrphanage().newOrphanCopy(Text::Reader("foobarba"));
  EXPECT_EQ("foobarba", orphan.getReader());

  auto root = builder.initRoot<TestAllTypes>();
  root.adoptTextField(kj::mv(orphan));
}